

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableSlow<google::protobuf::internal::LazyString>
          (ArenaStringPtr *this,Arena *arena,LazyString *lazy_default)

{
  string *psVar1;
  string *this_00;
  
  psVar1 = LazyString::get_abi_cxx11_(lazy_default);
  if (arena == (Arena *)0x0) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  }
  else {
    ArenaImpl::RecordAlloc((ArenaImpl *)arena,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    this_00 = (string *)
              ArenaImpl::AllocateAlignedAndAddCleanup
                        ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>);
    std::__cxx11::string::string((string *)this_00,(string *)psVar1);
  }
  (this->tagged_ptr_).ptr_ = this_00;
  return this_00;
}

Assistant:

std::string* ArenaStringPtr::MutableSlow(::google::protobuf::Arena* arena,
                                         const Lazy&... lazy_default) {
  const std::string* const default_value =
      sizeof...(Lazy) == 0 ? &GetEmptyStringAlreadyInited() : nullptr;
  GOOGLE_DCHECK(IsDefault(default_value));
  std::string* new_string =
      Arena::Create<std::string>(arena, lazy_default.get()...);
  tagged_ptr_.Set(new_string);
  return new_string;
}